

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O0

timestamp_t
duckdb::DateTrunc::
UnaryFunction<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::MillisecondOperator>
          (date_t input)

{
  bool bVar1;
  date_t in_EDI;
  date_t in_stack_0000002c;
  undefined8 local_8;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(in_EDI);
  if (bVar1) {
    local_8 = MillisecondOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(in_EDI);
  }
  else {
    local_8 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>(in_stack_0000002c);
  }
  return (timestamp_t)local_8;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}